

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode * __thiscall JSONNode::at(JSONNode *this,json_index_t pos)

{
  internalJSONNode *piVar1;
  json_index_t jVar2;
  json_index_t jVar3;
  out_of_range *this_00;
  string *psVar4;
  JSONNode *pJVar5;
  allocator local_71;
  json_string local_70;
  allocator local_39;
  json_string local_38;
  json_index_t local_14;
  JSONNode *pJStack_10;
  json_index_t pos_local;
  JSONNode *this_local;
  
  piVar1 = this->internal;
  local_14 = pos;
  pJStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  jVar2 = local_14;
  jVar3 = internalJSONNode::size(this->internal);
  if (jVar3 <= jVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"at() out of bounds",&local_71);
    JSONDebug::_JSON_FAIL(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    psVar4 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
    std::out_of_range::out_of_range(this_00,(string *)psVar4);
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  pJVar5 = operator[](this,local_14);
  return pJVar5;
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    if (json_unlikely(pos >= internal -> size())){
	   JSON_FAIL(JSON_TEXT("at() out of bounds"));
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }
    return (*this)[pos];
}